

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Common.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseParenthesizedTypeNameOrExpression(Parser *this,TypeReferenceSyntax **tyRef)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *this_00;
  ExpressionAsTypeReferenceSyntax *pEVar3;
  ExpressionAsTypeReferenceSyntax *exprAsTyRef_1;
  ExpressionSyntax *unaryExpr;
  TypeNameAsTypeReferenceSyntax *nameAsTyRef;
  TypeNameSyntax *typeName;
  IndexType openParenTkIdx;
  ExpressionAsTypeReferenceSyntax *local_a8;
  ExpressionAsTypeReferenceSyntax *exprAsTyRef;
  ExpressionSyntax *local_90;
  ExpressionSyntax *expr;
  Backtracker BT;
  TypeReferenceSyntax **tyRef_local;
  Parser *this_local;
  
  BT.chained_.c.
  super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)tyRef;
  this_00 = peek(this,1);
  SVar2 = SyntaxToken::kind(this_00);
  if (SVar2 == OpenParenToken) {
    Backtracker::Backtracker((Backtracker *)&expr,this,0);
    local_90 = (ExpressionSyntax *)0x0;
    bVar1 = parseExpressionWithPrecedenceUnary(this,&local_90);
    if (bVar1) {
      local_a8 = makeNode<psy::C::ExpressionAsTypeReferenceSyntax>(this);
      *BT.chained_.c.
       super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node = (Backtracker **)local_a8;
      local_a8->expr_ = local_90;
      SVar2 = C::SyntaxNode::kind(&local_90->super_SyntaxNode);
      if (SVar2 == ParenthesizedExpression) {
        maybeAmbiguateTypeReference
                  (this,(TypeReferenceSyntax **)
                        BT.chained_.c.
                        super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node);
      }
      this_local._7_1_ = true;
    }
    else {
      Backtracker::backtrack((Backtracker *)&expr);
      typeName = (TypeNameSyntax *)consume(this);
      nameAsTyRef = (TypeNameAsTypeReferenceSyntax *)0x0;
      bVar1 = parseTypeName(this,(TypeNameSyntax **)&nameAsTyRef);
      if (bVar1) {
        unaryExpr = (ExpressionSyntax *)makeNode<psy::C::TypeNameAsTypeReferenceSyntax>(this);
        *BT.chained_.c.
         super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node = (Backtracker **)unaryExpr;
        ((TypeNameAsTypeReferenceSyntax *)unaryExpr)->openParenTkIdx_ = (IndexType)typeName;
        ((TypeNameAsTypeReferenceSyntax *)unaryExpr)->typeName_ = (TypeNameSyntax *)nameAsTyRef;
        this_local._7_1_ =
             matchOrSkipTo(this,CloseParenToken,
                           &((TypeNameAsTypeReferenceSyntax *)unaryExpr)->closeParenTkIdx_);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    openParenTkIdx._4_4_ = 1;
    Backtracker::~Backtracker((Backtracker *)&expr);
  }
  else {
    exprAsTyRef_1 = (ExpressionAsTypeReferenceSyntax *)0x0;
    bVar1 = parseExpressionWithPrecedenceUnary(this,(ExpressionSyntax **)&exprAsTyRef_1);
    if (bVar1) {
      pEVar3 = makeNode<psy::C::ExpressionAsTypeReferenceSyntax>(this);
      *BT.chained_.c.
       super__Deque_base<const_psy::C::Parser::Backtracker_*,_std::allocator<const_psy::C::Parser::Backtracker_*>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node = (Backtracker **)pEVar3;
      pEVar3->expr_ = (ExpressionSyntax *)exprAsTyRef_1;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseParenthesizedTypeNameOrExpression(TypeReferenceSyntax*& tyRef)
{
    switch (peek().kind()) {
        case SyntaxKind::OpenParenToken: {
            Backtracker BT(this);
            ExpressionSyntax* expr = nullptr;
            if (parseExpressionWithPrecedenceUnary(expr)) {
                auto exprAsTyRef = makeNode<ExpressionAsTypeReferenceSyntax>();
                tyRef = exprAsTyRef;
                exprAsTyRef->expr_ = expr;
                if (expr->kind() == SyntaxKind::ParenthesizedExpression)
                    maybeAmbiguateTypeReference(tyRef);
                return true;
            }

            BT.backtrack();
            auto openParenTkIdx = consume();
            TypeNameSyntax* typeName = nullptr;
            if (!parseTypeName(typeName))
                return false;

            auto nameAsTyRef = makeNode<TypeNameAsTypeReferenceSyntax>();
            tyRef = nameAsTyRef;
            nameAsTyRef->openParenTkIdx_ = openParenTkIdx;
            nameAsTyRef->typeName_ = typeName;
            return matchOrSkipTo(SyntaxKind::CloseParenToken, &nameAsTyRef->closeParenTkIdx_);
        }

        default: {
            ExpressionSyntax* unaryExpr = nullptr;
            if (!parseExpressionWithPrecedenceUnary(unaryExpr))
                return false;
            auto exprAsTyRef = makeNode<ExpressionAsTypeReferenceSyntax>();
            tyRef = exprAsTyRef;
            exprAsTyRef->expr_ = unaryExpr;
            return true;
        }
    }
}